

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfCompressor.cpp
# Opt level: O0

Compressor *
Imf_3_2::newTileCompressor(Compression c,size_t tileLineSize,size_t numTileLines,Header *hdr)

{
  Header *in_RCX;
  ZipCompressor *this;
  Pxr24Compressor *in_RDX;
  undefined8 in_RSI;
  int in_EDI;
  DwaCompressor *unaff_retaddr;
  size_t in_stack_00000038;
  size_t in_stack_00000040;
  Header *in_stack_00000048;
  PizCompressor *in_stack_00000050;
  undefined4 in_stack_00000088;
  size_t in_stack_00000090;
  Header *in_stack_00000098;
  B44Compressor *in_stack_000000a0;
  unsigned_long in_stack_ffffffffffffff88;
  unsigned_long in_stack_ffffffffffffff90;
  size_t in_stack_ffffffffffffffa0;
  size_t in_stack_ffffffffffffffa8;
  size_t in_stack_ffffffffffffffb0;
  Header *in_stack_ffffffffffffffb8;
  size_t in_stack_ffffffffffffffc8;
  size_t in_stack_ffffffffffffffd0;
  AcCompression acCompression;
  int in_stack_fffffffffffffff0;
  Header *in_stack_fffffffffffffff8;
  Header *hdr_00;
  
  acCompression = (AcCompression)((ulong)in_RSI >> 0x20);
  this = (ZipCompressor *)(ulong)(in_EDI - 1);
  switch(this) {
  case (ZipCompressor *)0x0:
    hdr_00 = (Header *)operator_new(0x28);
    uiMult<unsigned_long>(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
    RleCompressor::RleCompressor((RleCompressor *)in_RCX,hdr_00,in_stack_ffffffffffffffa0);
    break;
  case (ZipCompressor *)0x1:
  case (ZipCompressor *)0x2:
    hdr_00 = (Header *)operator_new(0x38);
    ZipCompressor::ZipCompressor
              (this,in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
    break;
  case (ZipCompressor *)0x3:
    hdr_00 = (Header *)operator_new(0x58);
    PizCompressor::PizCompressor
              (in_stack_00000050,in_stack_00000048,in_stack_00000040,in_stack_00000038);
    break;
  case (ZipCompressor *)0x4:
    hdr_00 = (Header *)operator_new(0x40);
    Pxr24Compressor::Pxr24Compressor
              (in_RDX,in_RCX,in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
    break;
  case (ZipCompressor *)0x5:
    hdr_00 = (Header *)operator_new(0x58);
    B44Compressor::B44Compressor
              (in_stack_000000a0,in_stack_00000098,in_stack_00000090,CONCAT44(c,in_stack_00000088),
               tileLineSize._7_1_);
    break;
  case (ZipCompressor *)0x6:
    hdr_00 = (Header *)operator_new(0x58);
    B44Compressor::B44Compressor
              (in_stack_000000a0,in_stack_00000098,in_stack_00000090,CONCAT44(c,in_stack_00000088),
               tileLineSize._7_1_);
    break;
  case (ZipCompressor *)0x7:
    hdr_00 = (Header *)operator_new(0x128);
    DwaCompressor::DwaCompressor
              (unaff_retaddr,in_stack_fffffffffffffff8,in_EDI,in_stack_fffffffffffffff0,
               acCompression);
    break;
  case (ZipCompressor *)0x8:
    hdr_00 = (Header *)operator_new(0x128);
    DwaCompressor::DwaCompressor
              (unaff_retaddr,in_stack_fffffffffffffff8,in_EDI,in_stack_fffffffffffffff0,
               acCompression);
    break;
  default:
    hdr_00 = (Header *)0x0;
  }
  return (Compressor *)hdr_00;
}

Assistant:

Compressor*
newTileCompressor (
    Compression c, size_t tileLineSize, size_t numTileLines, const Header& hdr)
{
    switch (c)
    {
        case RLE_COMPRESSION:

            return new RleCompressor (hdr, uiMult (tileLineSize, numTileLines));

        case ZIPS_COMPRESSION:
        case ZIP_COMPRESSION:

            return new ZipCompressor (hdr, tileLineSize, numTileLines);

        case PIZ_COMPRESSION:

            return new PizCompressor (hdr, tileLineSize, numTileLines);

        case PXR24_COMPRESSION:

            return new Pxr24Compressor (hdr, tileLineSize, numTileLines);

        case B44_COMPRESSION:

            return new B44Compressor (hdr, tileLineSize, numTileLines, false);

        case B44A_COMPRESSION:

            return new B44Compressor (hdr, tileLineSize, numTileLines, true);

        case DWAA_COMPRESSION:

            return new DwaCompressor (
                hdr,
                static_cast<int> (tileLineSize),
                static_cast<int> (numTileLines),
                DwaCompressor::DEFLATE);

        case DWAB_COMPRESSION:

            return new DwaCompressor (
                hdr,
                static_cast<int> (tileLineSize),
                static_cast<int> (numTileLines),
                DwaCompressor::STATIC_HUFFMAN);

        default: return 0;
    }
}